

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseQuotedText(WastParser *this,string *text)

{
  anon_union_16_2_ecfd7102_for_Location_1 *paVar1;
  byte c;
  bool bVar2;
  TokenType TVar3;
  Result RVar4;
  char *pcVar5;
  char *pcVar6;
  uint32_t hi;
  Token token;
  uint32_t local_90;
  uint32_t local_8c;
  anon_union_24_4_98baf137_for_Token_2 local_88;
  Token local_70;
  
  TVar3 = Peek(this,0);
  if (TVar3 == Text) {
    Consume(&local_70,this);
    if (5 < local_70.token_type_ - AlignEqNat) {
      __assert_fail("HasText()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/token.h"
                    ,0x62,"string_view wabt::Token::text() const");
    }
    local_88.text_.size_ = local_70.field_2.text_.size_;
    local_88.text_.data_ = local_70.field_2.text_.data_;
    if (2 < local_70.field_2.text_.size_) {
      local_88.text_ = string_view::substr(&local_88.text_,1,local_70.field_2.text_.size_ - 2);
      pcVar5 = local_88.text_.data_;
      if (0 < (long)local_88.text_.size_) {
        pcVar6 = pcVar5 + local_88.text_.size_;
        do {
          if (*pcVar5 == '\\') {
            c = pcVar5[1];
            if (c < 0x6e) {
              if (((c != 0x22) && (c != 0x27)) && (c != 0x5c)) {
LAB_0015ab3d:
                RVar4 = ParseHexdigit(c,&local_8c);
                if ((RVar4.enum_ != Ok) ||
                   (RVar4 = ParseHexdigit(pcVar5[2],&local_90), RVar4.enum_ != Ok)) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/wast-parser.cc"
                                ,0x58,
                                "void wabt::(anonymous namespace)::RemoveEscapes(string_view, OutputIter) [OutputIter = std::back_insert_iterator<std::basic_string<char>>]"
                               );
                }
                pcVar5 = pcVar5 + 2;
                goto LAB_0015ab00;
              }
            }
            else if (((c != 0x74) && (c != 0x72)) && (c != 0x6e)) goto LAB_0015ab3d;
            std::__cxx11::string::push_back((char)text);
            pcVar5 = pcVar5 + 1;
          }
          else {
LAB_0015ab00:
            std::__cxx11::string::push_back((char)text);
          }
          pcVar5 = pcVar5 + 1;
        } while (pcVar5 < pcVar6);
      }
    }
    bVar2 = IsValidUtf8((text->_M_dataplus)._M_p,text->_M_string_length);
    if (!bVar2) {
      Error(this,0x18a6e4);
    }
    RVar4.enum_ = Ok;
  }
  else {
    paVar1 = &local_70.loc.field_1;
    local_70.loc.filename.data_ = (char *)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"a quoted string","");
    local_88.text_ = (string_view)ZEXT816(0);
    local_88.literal_.text.size_ = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
               &local_70,&local_70.token_type_);
    RVar4 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_88.text_,"\"foo\"");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_88.text_);
    if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_70.loc.filename.data_ != paVar1) {
      operator_delete(local_70.loc.filename.data_);
    }
  }
  return (Result)RVar4.enum_;
}

Assistant:

Result WastParser::ParseQuotedText(std::string* text) {
  WABT_TRACE(ParseQuotedText);
  if (!PeekMatch(TokenType::Text)) {
    return ErrorExpected({"a quoted string"}, "\"foo\"");
  }

  Token token = Consume();
  RemoveEscapes(token.text(), std::back_inserter(*text));
  if (!IsValidUtf8(text->data(), text->length())) {
    Error(token.loc, "quoted string has an invalid utf-8 encoding");
  }
  return Result::Ok;
}